

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_x86_fma.cpp
# Opt level: O1

int __thiscall ncnn::LSTM_x86_fma::create_pipeline(LSTM_x86_fma *this,Option *opt)

{
  long lVar1;
  _func_int *p_Var2;
  _func_int **pp_Var3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  void *pvVar7;
  void *pvVar8;
  size_t sVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  int *piVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  uint _w;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  int iVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  ulong uVar36;
  long lVar37;
  void *pvVar38;
  void *pvVar39;
  undefined4 *puVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  uint _c;
  long lVar45;
  undefined4 *puVar46;
  uint uVar47;
  ulong uVar48;
  long local_128;
  long local_f0;
  long local_d0;
  int iVar26;
  
  p_Var2 = this->_vptr_LSTM_x86_fma[-3];
  _c = (*(int *)(p_Var2 + 0x40 + (long)&(this->weight_hc_data_packed).data) == 2) + 1;
  iVar31 = *(int *)(p_Var2 + 0x44 + (long)&(this->weight_hc_data_packed).data);
  iVar15 = (int)((long)((ulong)(uint)((int)((long)*(int *)(p_Var2 + 0x3c +
                                                          (long)&(this->weight_hc_data_packed).data)
                                           / (long)(int)_c) >> 0x1f) << 0x20 |
                       (long)*(int *)(p_Var2 + 0x3c + (long)&(this->weight_hc_data_packed).data) /
                       (long)(int)_c & 0xffffffffU) / (long)iVar31);
  iVar26 = iVar15 + 3;
  if (-1 < iVar15) {
    iVar26 = iVar15;
  }
  _w = iVar26 >> 2;
  uVar48 = 0;
  Mat::create(&this->weight_xc_data_packed,_w,iVar31 / 2 + iVar31 % 2,_c,0x20,8,(Allocator *)0x0);
  Mat::create(&this->bias_c_data_packed,
              *(int *)(this->_vptr_LSTM_x86_fma[-3] + 0x44 +
                      (long)&(this->weight_hc_data_packed).data),1,_c,0x10,4,(Allocator *)0x0);
  iVar31 = *(int *)(this->_vptr_LSTM_x86_fma[-3] + 0x44 + (long)&(this->weight_hc_data_packed).data)
  ;
  Mat::create(&this->weight_hc_data_packed,
              *(int *)(this->_vptr_LSTM_x86_fma[-3] + 0x38 +
                      (long)&(this->weight_hc_data_packed).data),iVar31 / 2 + iVar31 % 2,_c,0x20,8,
              (Allocator *)0x0);
  pp_Var3 = this->_vptr_LSTM_x86_fma;
  pvVar39 = (this->weight_xc_data_packed).data;
  sVar4 = (this->weight_xc_data_packed).elemsize;
  sVar5 = (this->bias_c_data_packed).cstep;
  sVar6 = (this->bias_c_data_packed).elemsize;
  pvVar7 = (this->bias_c_data_packed).data;
  pvVar8 = (this->weight_hc_data_packed).data;
  sVar9 = (this->weight_hc_data_packed).elemsize;
  lVar35 = (this->weight_hc_data_packed).cstep * sVar9;
  lVar32 = (long)(this->weight_hc_data_packed).w * sVar9;
  lVar19 = (this->weight_xc_data_packed).cstep * sVar4;
  lVar27 = (long)(this->weight_xc_data_packed).w * sVar4;
  local_f0 = (long)pvVar39 + 8;
  local_128 = (long)pvVar8 + 8;
  do {
    p_Var2 = pp_Var3[-3];
    lVar33 = (long)*(int *)(&this->field_0x154 + (long)p_Var2);
    lVar10 = *(long *)(&this->field_0x128 + (long)p_Var2);
    lVar34 = *(long *)(&this->field_0x168 + (long)p_Var2);
    lVar11 = *(long *)(&this->field_0x138 + (long)p_Var2);
    lVar45 = *(long *)(&this->field_0x1b0 + (long)p_Var2) * uVar48 *
             *(long *)(&this->field_0x180 + (long)p_Var2) +
             *(long *)(&this->field_0x170 + (long)p_Var2);
    lVar43 = (long)*(int *)(&this->field_0x10c + (long)p_Var2);
    lVar12 = *(long *)(&this->field_0xe0 + (long)p_Var2);
    lVar44 = *(long *)(&this->field_0x120 + (long)p_Var2);
    lVar13 = *(long *)(&this->field_0xf0 + (long)p_Var2);
    puVar40 = (undefined4 *)(sVar5 * sVar6 * uVar48 + (long)pvVar7);
    lVar20 = (long)*(int *)(&this->field_0x19c + (long)p_Var2) *
             *(long *)(&this->field_0x180 + (long)p_Var2);
    lVar28 = lVar20 * 3 + lVar45;
    lVar1 = lVar45 + lVar20;
    lVar20 = lVar45 + lVar20 * 2;
    if (*(int *)(p_Var2 + 0x44 + (long)&(this->weight_hc_data_packed).data) < 2) {
      uVar36 = 0;
    }
    else {
      lVar41 = lVar34 * uVar48;
      local_d0 = (lVar41 + lVar33) * lVar11 + lVar10;
      lVar30 = lVar11 * lVar33 * 2;
      lVar42 = lVar41 * lVar11 + lVar10;
      lVar21 = lVar44 * uVar48;
      lVar29 = (lVar21 + lVar43) * lVar13 + lVar12;
      lVar37 = lVar13 * lVar43 * 2;
      lVar22 = lVar21 * lVar13 + lVar12;
      iVar31 = 1;
      uVar36 = 0;
      pvVar38 = pvVar39;
      do {
        *puVar40 = *(undefined4 *)(lVar45 + uVar36 * 4);
        puVar40[1] = *(undefined4 *)(lVar1 + uVar36 * 4);
        puVar40[2] = *(undefined4 *)(lVar20 + uVar36 * 4);
        puVar40[3] = *(undefined4 *)(lVar28 + uVar36 * 4);
        puVar40[4] = *(undefined4 *)(lVar45 + 4 + uVar36 * 4);
        puVar40[5] = *(undefined4 *)(lVar1 + 4 + uVar36 * 4);
        puVar40[6] = *(undefined4 *)(lVar20 + 4 + uVar36 * 4);
        puVar40[7] = *(undefined4 *)(lVar28 + 4 + uVar36 * 4);
        iVar26 = *(int *)(pp_Var3[-3] + 0x44 + (long)&(this->weight_hc_data_packed).data);
        iVar18 = iVar26 * 2;
        iVar17 = iVar26 * 3;
        iVar16 = (int)uVar36;
        if (3 < iVar15) {
          lVar25 = 0;
          uVar23 = (ulong)_w;
          do {
            *(undefined4 *)((long)pvVar38 + lVar25 * 8) = *(undefined4 *)(lVar42 + lVar25);
            *(undefined4 *)((long)pvVar38 + lVar25 * 8 + 4) =
                 *(undefined4 *)(((iVar26 + iVar16) * lVar33 + lVar41) * lVar11 + lVar10 + lVar25);
            *(undefined4 *)((long)pvVar38 + lVar25 * 8 + 8) =
                 *(undefined4 *)(((iVar18 + iVar16) * lVar33 + lVar41) * lVar11 + lVar10 + lVar25);
            *(undefined4 *)((long)pvVar38 + lVar25 * 8 + 0xc) =
                 *(undefined4 *)(((iVar16 + iVar17) * lVar33 + lVar41) * lVar11 + lVar10 + lVar25);
            *(undefined4 *)((long)pvVar38 + lVar25 * 8 + 0x10) = *(undefined4 *)(local_d0 + lVar25);
            *(undefined4 *)((long)pvVar38 + lVar25 * 8 + 0x14) =
                 *(undefined4 *)(((iVar26 + iVar31) * lVar33 + lVar41) * lVar11 + lVar10 + lVar25);
            *(undefined4 *)((long)pvVar38 + lVar25 * 8 + 0x18) =
                 *(undefined4 *)(((iVar18 + iVar31) * lVar33 + lVar41) * lVar11 + lVar10 + lVar25);
            *(undefined4 *)((long)pvVar38 + lVar25 * 8 + 0x1c) =
                 *(undefined4 *)(((iVar31 + iVar17) * lVar33 + lVar41) * lVar11 + lVar10 + lVar25);
            lVar25 = lVar25 + 4;
            uVar23 = uVar23 - 1;
          } while (uVar23 != 0);
        }
        if (0 < *(int *)(pp_Var3[-3] + 0x38 + (long)&(this->weight_hc_data_packed).data)) {
          puVar46 = (undefined4 *)((long)pvVar8 + (uVar36 >> 1) * lVar32 + lVar35 * uVar48);
          lVar25 = 0;
          do {
            *puVar46 = *(undefined4 *)(lVar22 + lVar25 * 4);
            puVar46[1] = *(undefined4 *)
                          (((iVar26 + iVar16) * lVar43 + lVar21) * lVar13 + lVar12 + lVar25 * 4);
            puVar46[2] = *(undefined4 *)
                          (((iVar18 + iVar16) * lVar43 + lVar21) * lVar13 + lVar12 + lVar25 * 4);
            puVar46[3] = *(undefined4 *)
                          (((iVar17 + iVar16) * lVar43 + lVar21) * lVar13 + lVar12 + lVar25 * 4);
            puVar46[4] = *(undefined4 *)(lVar29 + lVar25 * 4);
            puVar46[5] = *(undefined4 *)
                          (((iVar31 + iVar26) * lVar43 + lVar21) * lVar13 + lVar12 + lVar25 * 4);
            puVar46[6] = *(undefined4 *)
                          (((iVar31 + iVar18) * lVar43 + lVar21) * lVar13 + lVar12 + lVar25 * 4);
            puVar46[7] = *(undefined4 *)
                          (((iVar31 + iVar17) * lVar43 + lVar21) * lVar13 + lVar12 + lVar25 * 4);
            lVar25 = lVar25 + 1;
            puVar46 = puVar46 + 8;
          } while (lVar25 < *(int *)(pp_Var3[-3] + 0x38 + (long)&(this->weight_hc_data_packed).data)
                  );
        }
        puVar40 = puVar40 + 8;
        uVar36 = uVar36 + 2;
        iVar31 = iVar31 + 2;
        local_d0 = local_d0 + lVar30;
        lVar42 = lVar42 + lVar30;
        pvVar38 = (void *)((long)pvVar38 + lVar27);
        lVar29 = lVar29 + lVar37;
        lVar22 = lVar22 + lVar37;
      } while ((int)((uint)uVar36 | 1) <
               *(int *)(pp_Var3[-3] + 0x44 + (long)&(this->weight_hc_data_packed).data));
    }
    if ((int)uVar36 < *(int *)(pp_Var3[-3] + 0x44 + (long)&(this->weight_hc_data_packed).data)) {
      uVar23 = uVar36 & 0xffffffff;
      lVar34 = lVar34 * uVar48;
      lVar30 = (lVar33 * uVar23 + lVar34) * lVar11 + lVar10;
      lVar44 = lVar44 * uVar48;
      lVar37 = (lVar43 * uVar23 + lVar44) * lVar13 + lVar12;
      do {
        uVar47 = (uint)uVar36;
        uVar36 = (ulong)((uVar47 & 1) + ((uint)(uVar36 >> 1) & 0x7fffffff));
        *puVar40 = *(undefined4 *)(lVar45 + uVar23 * 4);
        puVar40[1] = *(undefined4 *)(lVar1 + uVar23 * 4);
        puVar40[2] = *(undefined4 *)(lVar20 + uVar23 * 4);
        puVar40[3] = *(undefined4 *)(lVar28 + uVar23 * 4);
        iVar31 = *(int *)(pp_Var3[-3] + 0x44 + (long)&(this->weight_hc_data_packed).data);
        if (3 < iVar15) {
          puVar46 = (undefined4 *)(lVar27 * uVar36 + local_f0);
          uVar24 = 0;
          do {
            puVar46[-2] = *(undefined4 *)(lVar30 + uVar24 * 4);
            puVar46[-1] = *(undefined4 *)
                           (((int)(iVar31 + uVar47) * lVar33 + lVar34) * lVar11 + lVar10 +
                           uVar24 * 4);
            *puVar46 = *(undefined4 *)
                        (((int)(iVar31 * 2 + uVar47) * lVar33 + lVar34) * lVar11 + lVar10 +
                        uVar24 * 4);
            puVar46[1] = *(undefined4 *)
                          (((int)(uVar47 + iVar31 * 3) * lVar33 + lVar34) * lVar11 + lVar10 +
                          uVar24 * 4);
            uVar24 = uVar24 + 1;
            puVar46 = puVar46 + 4;
          } while (_w != uVar24);
        }
        if (0 < *(int *)(pp_Var3[-3] + 0x38 + (long)&(this->weight_hc_data_packed).data)) {
          puVar46 = (undefined4 *)(uVar36 * lVar32 + local_128);
          lVar21 = 0;
          do {
            puVar46[-2] = *(undefined4 *)(lVar37 + lVar21 * 4);
            puVar46[-1] = *(undefined4 *)
                           (((int)(iVar31 + uVar47) * lVar43 + lVar44) * lVar13 + lVar12 +
                           lVar21 * 4);
            *puVar46 = *(undefined4 *)
                        (((int)(iVar31 * 2 + uVar47) * lVar43 + lVar44) * lVar13 + lVar12 +
                        lVar21 * 4);
            puVar46[1] = *(undefined4 *)
                          (((int)(iVar31 * 3 + uVar47) * lVar43 + lVar44) * lVar13 + lVar12 +
                          lVar21 * 4);
            lVar21 = lVar21 + 1;
            puVar46 = puVar46 + 4;
          } while (lVar21 < *(int *)(pp_Var3[-3] + 0x38 + (long)&(this->weight_hc_data_packed).data)
                  );
        }
        puVar40 = puVar40 + 4;
        uVar23 = uVar23 + 1;
        uVar36 = (ulong)(uVar47 + 1);
        lVar30 = lVar30 + lVar11 * lVar33;
        lVar37 = lVar37 + lVar13 * lVar43;
      } while ((long)uVar23 <
               (long)*(int *)(pp_Var3[-3] + 0x44 + (long)&(this->weight_hc_data_packed).data));
    }
    uVar48 = uVar48 + 1;
    pvVar39 = (void *)((long)pvVar39 + lVar19);
    local_f0 = local_f0 + lVar19;
    local_128 = local_128 + lVar35;
  } while (uVar48 != _c);
  if (opt->lightmode != false) {
    p_Var2 = this->_vptr_LSTM_x86_fma[-3];
    piVar14 = *(int **)(&this->field_0x130 + (long)p_Var2);
    if (piVar14 != (int *)0x0) {
      LOCK();
      *piVar14 = *piVar14 + -1;
      UNLOCK();
      if (*piVar14 == 0) {
        if (*(long **)(&this->field_0x148 + (long)p_Var2) == (long *)0x0) {
          if (*(void **)(&this->field_0x128 + (long)p_Var2) != (void *)0x0) {
            free(*(void **)(&this->field_0x128 + (long)p_Var2));
          }
        }
        else {
          (**(code **)(**(long **)(&this->field_0x148 + (long)p_Var2) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x168 + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x134 + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x13c + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x128 + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x130 + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x150 + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x158 + (long)p_Var2) = 0;
    *(undefined4 *)(&this->field_0x160 + (long)p_Var2) = 0;
    p_Var2 = this->_vptr_LSTM_x86_fma[-3];
    piVar14 = *(int **)(&this->field_0x178 + (long)p_Var2);
    if (piVar14 != (int *)0x0) {
      LOCK();
      *piVar14 = *piVar14 + -1;
      UNLOCK();
      if (*piVar14 == 0) {
        if (*(long **)(&this->field_0x190 + (long)p_Var2) == (long *)0x0) {
          if (*(void **)(&this->field_0x170 + (long)p_Var2) != (void *)0x0) {
            free(*(void **)(&this->field_0x170 + (long)p_Var2));
          }
        }
        else {
          (**(code **)(**(long **)(&this->field_0x190 + (long)p_Var2) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x1b0 + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x17c + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x184 + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x170 + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x178 + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x198 + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x1a0 + (long)p_Var2) = 0;
    *(undefined4 *)(&this->field_0x1a8 + (long)p_Var2) = 0;
    p_Var2 = this->_vptr_LSTM_x86_fma[-3];
    piVar14 = *(int **)(&this->field_0xe8 + (long)p_Var2);
    if (piVar14 != (int *)0x0) {
      LOCK();
      *piVar14 = *piVar14 + -1;
      UNLOCK();
      if (*piVar14 == 0) {
        if (*(long **)(&this->field_0x100 + (long)p_Var2) == (long *)0x0) {
          if (*(void **)(&this->field_0xe0 + (long)p_Var2) != (void *)0x0) {
            free(*(void **)(&this->field_0xe0 + (long)p_Var2));
          }
        }
        else {
          (**(code **)(**(long **)(&this->field_0x100 + (long)p_Var2) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x120 + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0xec + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0xf4 + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0xe0 + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0xe8 + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x108 + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x110 + (long)p_Var2) = 0;
    *(undefined4 *)(&this->field_0x118 + (long)p_Var2) = 0;
  }
  return 0;
}

Assistant:

int LSTM_x86_fma::create_pipeline(const Option& opt)
{
    // pack IFOG
    int num_directions = direction == 2 ? 2 : 1;
    int size = weight_data_size / num_directions / hidden_size / 4;

#if __AVX__
    weight_xc_data_packed.create(size, hidden_size / 2 + hidden_size % 2, num_directions, 32u, 8);
    bias_c_data_packed.create(hidden_size, 1, num_directions, 16u, 4);
    weight_hc_data_packed.create(num_output, hidden_size / 2 + hidden_size % 2, num_directions, 32u, 8);
#else
    weight_xc_data_packed.create(size, hidden_size, num_directions, 16u, 4);
    bias_c_data_packed.create(hidden_size, 1, num_directions, 16u, 4);
    weight_hc_data_packed.create(num_output, hidden_size, num_directions, 16u, 4);
#endif

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int dr = 0; dr < num_directions; dr++)
    {
        const Mat weight_xc = weight_xc_data.channel(dr);
        const Mat bias_c = bias_c_data.channel(dr);
        const Mat weight_hc = weight_hc_data.channel(dr);

        Mat weight_xc_data_packed_dr = weight_xc_data_packed.channel(dr);
        Mat bias_c_data_packed_dr = bias_c_data_packed.channel(dr);
        Mat weight_hc_data_packed_dr = weight_hc_data_packed.channel(dr);

        const float* bias_c_I = bias_c.row(0);
        const float* bias_c_F = bias_c.row(1);
        const float* bias_c_O = bias_c.row(2);
        const float* bias_c_G = bias_c.row(3);

        float* bias_c_IFOG = bias_c_data_packed_dr.row(0);

        int q = 0;
#if __AVX__
        for (; q + 1 < hidden_size; q += 2)
        {
            bias_c_IFOG[0] = bias_c_I[q];
            bias_c_IFOG[1] = bias_c_F[q];
            bias_c_IFOG[2] = bias_c_O[q];
            bias_c_IFOG[3] = bias_c_G[q];
            bias_c_IFOG[4] = bias_c_I[q + 1];
            bias_c_IFOG[5] = bias_c_F[q + 1];
            bias_c_IFOG[6] = bias_c_O[q + 1];
            bias_c_IFOG[7] = bias_c_G[q + 1];

            bias_c_IFOG += 8;

            const float* weight_xc_I = weight_xc.row(hidden_size * 0 + q);
            const float* weight_xc_F = weight_xc.row(hidden_size * 1 + q);
            const float* weight_xc_O = weight_xc.row(hidden_size * 2 + q);
            const float* weight_xc_G = weight_xc.row(hidden_size * 3 + q);
            const float* weight_xc_I_1 = weight_xc.row(hidden_size * 0 + q + 1);
            const float* weight_xc_F_1 = weight_xc.row(hidden_size * 1 + q + 1);
            const float* weight_xc_O_1 = weight_xc.row(hidden_size * 2 + q + 1);
            const float* weight_xc_G_1 = weight_xc.row(hidden_size * 3 + q + 1);

            const float* weight_hc_I = weight_hc.row(hidden_size * 0 + q);
            const float* weight_hc_F = weight_hc.row(hidden_size * 1 + q);
            const float* weight_hc_O = weight_hc.row(hidden_size * 2 + q);
            const float* weight_hc_G = weight_hc.row(hidden_size * 3 + q);
            const float* weight_hc_I_1 = weight_hc.row(hidden_size * 0 + q + 1);
            const float* weight_hc_F_1 = weight_hc.row(hidden_size * 1 + q + 1);
            const float* weight_hc_O_1 = weight_hc.row(hidden_size * 2 + q + 1);
            const float* weight_hc_G_1 = weight_hc.row(hidden_size * 3 + q + 1);

            float* weight_xc_IFOG = weight_xc_data_packed_dr.row(q / 2);
            float* weight_hc_IFOG = weight_hc_data_packed_dr.row(q / 2);

            for (int i = 0; i < size; i++)
            {
                weight_xc_IFOG[0] = weight_xc_I[i];
                weight_xc_IFOG[1] = weight_xc_F[i];
                weight_xc_IFOG[2] = weight_xc_O[i];
                weight_xc_IFOG[3] = weight_xc_G[i];
                weight_xc_IFOG[4] = weight_xc_I_1[i];
                weight_xc_IFOG[5] = weight_xc_F_1[i];
                weight_xc_IFOG[6] = weight_xc_O_1[i];
                weight_xc_IFOG[7] = weight_xc_G_1[i];

                weight_xc_IFOG += 8;
            }

            for (int i = 0; i < num_output; i++)
            {
                weight_hc_IFOG[0] = weight_hc_I[i];
                weight_hc_IFOG[1] = weight_hc_F[i];
                weight_hc_IFOG[2] = weight_hc_O[i];
                weight_hc_IFOG[3] = weight_hc_G[i];
                weight_hc_IFOG[4] = weight_hc_I_1[i];
                weight_hc_IFOG[5] = weight_hc_F_1[i];
                weight_hc_IFOG[6] = weight_hc_O_1[i];
                weight_hc_IFOG[7] = weight_hc_G_1[i];

                weight_hc_IFOG += 8;
            }
        }
#endif // __AVX__
        for (; q < hidden_size; q++)
        {
            bias_c_IFOG[0] = bias_c_I[q];
            bias_c_IFOG[1] = bias_c_F[q];
            bias_c_IFOG[2] = bias_c_O[q];
            bias_c_IFOG[3] = bias_c_G[q];

            bias_c_IFOG += 4;

            const float* weight_xc_I = weight_xc.row(hidden_size * 0 + q);
            const float* weight_xc_F = weight_xc.row(hidden_size * 1 + q);
            const float* weight_xc_O = weight_xc.row(hidden_size * 2 + q);
            const float* weight_xc_G = weight_xc.row(hidden_size * 3 + q);

            const float* weight_hc_I = weight_hc.row(hidden_size * 0 + q);
            const float* weight_hc_F = weight_hc.row(hidden_size * 1 + q);
            const float* weight_hc_O = weight_hc.row(hidden_size * 2 + q);
            const float* weight_hc_G = weight_hc.row(hidden_size * 3 + q);

#if __AVX__
            float* weight_xc_IFOG = weight_xc_data_packed_dr.row(q / 2 + q % 2);
            float* weight_hc_IFOG = weight_hc_data_packed_dr.row(q / 2 + q % 2);
#else
            float* weight_xc_IFOG = weight_xc_data_packed_dr.row(q);
            float* weight_hc_IFOG = weight_hc_data_packed_dr.row(q);
#endif

            for (int i = 0; i < size; i++)
            {
                weight_xc_IFOG[0] = weight_xc_I[i];
                weight_xc_IFOG[1] = weight_xc_F[i];
                weight_xc_IFOG[2] = weight_xc_O[i];
                weight_xc_IFOG[3] = weight_xc_G[i];

                weight_xc_IFOG += 4;
            }

            for (int i = 0; i < num_output; i++)
            {
                weight_hc_IFOG[0] = weight_hc_I[i];
                weight_hc_IFOG[1] = weight_hc_F[i];
                weight_hc_IFOG[2] = weight_hc_O[i];
                weight_hc_IFOG[3] = weight_hc_G[i];

                weight_hc_IFOG += 4;
            }
        }
    }

    if (opt.lightmode)
    {
        weight_xc_data.release();
        bias_c_data.release();
        weight_hc_data.release();
    }

    return 0;
}